

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O0

void memprof_write_lfunc(lj_wbuf *out,uint8_t aevent,GCfunc *fn,lua_State *L,cTValue *nextframe)

{
  BCLine BVar1;
  GCfunc *in_RCX;
  lua_State *in_RDX;
  cTValue *in_R8;
  BCLine line;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  
  BVar1 = lj_debug_frameline(in_RDX,in_RCX,in_R8);
  if (BVar1 < 0) {
    lj_wbuf_addbyte((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  }
  else {
    lj_wbuf_addbyte((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
    lj_wbuf_addu64((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),
                   CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    lj_wbuf_addu64((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),
                   CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void memprof_write_lfunc(struct lj_wbuf *out, uint8_t aevent,
				GCfunc *fn, struct lua_State *L,
				cTValue *nextframe)
{
  /*
  ** Line equals to zero when LuaJIT is built with the
  ** -DLUAJIT_DISABLE_DEBUGINFO flag.
  */
  const BCLine line = lj_debug_frameline(L, fn, nextframe);

  if (line < 0) {
    /*
    ** Line is >= 0 if we are inside a Lua function.
    ** There are cases when the memory profiler attempts
    ** to attribute allocations triggered by JIT engine recording
    ** phase with a Lua function to be recorded. It this case,
    ** lj_debug_frameline() may return BC_NOPOS (i.e. a negative value).
    ** We report such allocations as internal in order not to confuse users.
    */
    lj_wbuf_addbyte(out, aevent | ASOURCE_INT);
  } else {
    /*
    ** As a prototype is a source of an allocation, it has
    ** already been inserted into the symtab: on the start
    ** of the profiling or right after its creation.
    */
    lj_wbuf_addbyte(out, aevent | ASOURCE_LFUNC);
    lj_wbuf_addu64(out, (uintptr_t)funcproto(fn));
    lj_wbuf_addu64(out, (uint64_t)line);
  }
}